

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qresultstore.cpp
# Opt level: O1

int __thiscall
QtPrivate::ResultStoreBase::addResults
          (ResultStoreBase *this,int index,void *results,int vectorSize,int totalCount)

{
  int iVar1;
  long in_FS_OFFSET;
  ResultItem local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.result = results;
  if ((totalCount - vectorSize == 0) || (this->m_filterMode == false)) {
    local_38._4_4_ = 0xaaaaaaaa;
    local_38.m_count = vectorSize;
  }
  else {
    if (0 < vectorSize) {
      local_38._4_4_ = 0xaaaaaaaa;
      local_38.m_count = vectorSize;
      insertResultItem(this,index,&local_38);
    }
    local_38._4_4_ = 0xaaaaaaaa;
    local_38.m_count = totalCount - vectorSize;
    local_38.result = (void *)0x0;
    index = vectorSize + index;
  }
  iVar1 = insertResultItem(this,index,&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

int ResultStoreBase::addResults(int index, const void *results, int vectorSize, int totalCount)
{
    if (m_filterMode == false || vectorSize == totalCount) {
        Q_ASSERT(vectorSize != 0);
        ResultItem resultItem(results, vectorSize);
        return insertResultItem(index, resultItem);
    } else {
        if (vectorSize > 0) {
            ResultItem filteredIn(results, vectorSize);
            insertResultItem(index, filteredIn);
        }
        ResultItem filteredAway(nullptr, totalCount - vectorSize);
        return insertResultItem(index + vectorSize, filteredAway);
    }
}